

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O3

void __thiscall CCharacterCore::Tick(CCharacterCore *this,bool UseInput)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  CWorldCore *pCVar5;
  CCharacterCore *pCVar6;
  vec2 vVar7;
  vec2 vVar8;
  undefined1 auVar9 [16];
  CTuneParam *pCVar10;
  CTuningParams *pCVar11;
  CTuningParams *pCVar12;
  bool bVar13;
  bool bVar14;
  int i_1;
  long lVar15;
  ulong uVar16;
  int iVar17;
  CTuneParam *pCVar18;
  long in_FS_OFFSET;
  uint uVar19;
  uint uVar20;
  float fVar21;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar22;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar27;
  vec2 vVar23;
  vec2 vVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar33;
  vec2 vVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  vec2 vVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar43;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  vec2 NewPos;
  vec2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_TriggeredEvents = 0;
  fVar28 = (this->m_Pos).field_0.x + 14.0;
  fVar21 = (this->m_Pos).field_1.y + 14.0 + 5.0;
  uVar19 = -(uint)(0.0 < fVar28);
  uVar20 = -(uint)(0.0 < fVar21);
  bVar13 = CCollision::IsTile(this->m_pCollision,
                              (int)((float)(~uVar19 & 0xbf000000 | uVar19 & 0x3f000000) + fVar28),
                              (int)((float)(~uVar20 & 0xbf000000 | uVar20 & 0x3f000000) + fVar21),1)
  ;
  bVar14 = true;
  if (!bVar13) {
    fVar21 = (this->m_Pos).field_0.x + -14.0;
    fVar28 = (this->m_Pos).field_1.y + 14.0 + 5.0;
    uVar19 = -(uint)(0.0 < fVar21);
    uVar20 = -(uint)(0.0 < fVar28);
    bVar14 = CCollision::IsTile(this->m_pCollision,
                                (int)((float)(~uVar19 & 0xbf000000 | uVar19 & 0x3f000000) + fVar21),
                                (int)((float)(~uVar20 & 0xbf000000 | uVar20 & 0x3f000000) + fVar28),
                                1);
  }
  uVar1 = (this->m_Input).m_TargetX;
  uVar2 = (this->m_Input).m_TargetY;
  pCVar5 = this->m_pWorld;
  pCVar11 = &pCVar5->m_Tuning;
  pCVar12 = &pCVar5->m_Tuning;
  pCVar10 = &(pCVar5->m_Tuning).m_GroundControlAccel;
  pCVar18 = &(pCVar5->m_Tuning).m_GroundFriction;
  if (bVar14 == false) {
    pCVar18 = &(pCVar5->m_Tuning).m_AirFriction;
    pCVar5 = (CWorldCore *)&(pCVar5->m_Tuning).m_AirControlSpeed;
    pCVar10 = &pCVar12->m_AirControlAccel;
  }
  (this->m_Vel).field_1.y = (float)(pCVar11->m_Gravity).m_Value / 100.0 + (this->m_Vel).field_1.y;
  iVar17 = (pCVar5->m_Tuning).m_GroundControlSpeed.m_Value;
  iVar3 = pCVar10->m_Value;
  iVar4 = pCVar18->m_Value;
  if (UseInput) {
    fVar28 = (float)(int)uVar1;
    fVar33 = (float)(int)uVar2;
    auVar40._4_4_ = fVar33;
    auVar40._0_4_ = fVar28;
    this->m_Direction = (this->m_Input).m_Direction;
    fVar21 = atan2f(fVar33,fVar28);
    this->m_Angle = (int)(fVar21 * 256.0);
    uVar19 = this->m_Jumped;
    if ((this->m_Input).m_Jump == 0) {
      uVar19 = uVar19 & 0xfffffffe;
LAB_00144e84:
      this->m_Jumped = uVar19;
    }
    else if ((uVar19 & 1) == 0) {
      if (bVar14 == false) {
        if ((uVar19 & 2) != 0) goto LAB_00144e87;
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 2;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_AirJumpImpulse.m_Value / -100.0;
        uVar19 = uVar19 | 3;
      }
      else {
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 1;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_GroundJumpImpulse.m_Value / -100.0;
        uVar19 = uVar19 | 1;
      }
      goto LAB_00144e84;
    }
LAB_00144e87:
    if ((this->m_Input).m_Hook == 0) {
      this->m_HookState = 0;
      this->m_HookedPlayer = -1;
      this->m_HookPos = this->m_Pos;
    }
    else if (this->m_HookState == 0) {
      auVar40._8_8_ = 0;
      auVar25._0_4_ = SQRT(fVar28 * fVar28 + fVar33 * fVar33);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      auVar40 = divps(auVar40,auVar25);
      vVar29.field_0.x = (this->m_Pos).field_0.x + auVar40._0_4_ * 28.0 * 1.5;
      vVar29.field_1.y = (this->m_Pos).field_1.y + auVar40._4_4_ * 28.0 * 1.5;
      this->m_HookPos = vVar29;
      this->m_HookDir = auVar40._0_8_;
      this->m_HookedPlayer = -1;
      this->m_HookTick = 0;
      this->m_HookState = 4;
    }
  }
  fVar21 = (float)iVar17 / 100.0;
  fVar28 = (float)iVar3 / 100.0;
  if (this->m_Direction < 0) {
    fVar33 = (this->m_Vel).field_0.x;
    fVar48 = fVar33;
    if (fVar28 <= 0.0) {
      if ((fVar33 <= fVar21) && (fVar48 = fVar21, fVar33 - fVar28 <= fVar21)) {
        fVar48 = fVar33 - fVar28;
      }
    }
    else {
      auVar37._0_8_ = (ulong)(uint)fVar21 ^ 0x8000000080000000;
      auVar37._8_4_ = 0x80000000;
      auVar37._12_4_ = 0x80000000;
      if (-fVar21 <= fVar33) {
        if (-fVar21 <= fVar33 - fVar28) {
          auVar37._0_4_ = fVar33 - fVar28;
        }
        fVar48 = auVar37._0_4_;
      }
    }
  }
  else if (this->m_Direction == 0) {
    fVar48 = ((float)iVar4 / 100.0) * (this->m_Vel).field_0.x;
  }
  else {
    fVar33 = (this->m_Vel).field_0.x;
    fVar48 = fVar33;
    if (0.0 <= fVar28) {
      if ((fVar33 <= fVar21) && (fVar48 = fVar21, fVar28 + fVar33 <= fVar21)) {
        fVar48 = fVar28 + fVar33;
      }
    }
    else {
      auVar36._0_8_ = (ulong)(uint)fVar21 ^ 0x8000000080000000;
      auVar36._8_4_ = 0x80000000;
      auVar36._12_4_ = 0x80000000;
      if (-fVar21 <= fVar33) {
        if (-fVar21 <= fVar28 + fVar33) {
          auVar36._0_4_ = fVar28 + fVar33;
        }
        fVar48 = auVar36._0_4_;
      }
    }
  }
  (this->m_Vel).field_0.x = fVar48;
  if (bVar14 != false) {
    *(byte *)&this->m_Jumped = (byte)this->m_Jumped & 0xfd;
  }
  uVar19 = this->m_HookState;
  if (uVar19 == 0) {
    this->m_HookedPlayer = -1;
LAB_00144fb2:
    this->m_HookPos = this->m_Pos;
  }
  else {
    if (uVar19 < 3) {
      this->m_HookState = uVar19 + 1;
      goto LAB_00145447;
    }
    if (uVar19 == 4) {
      fVar21 = (float)(this->m_pWorld->m_Tuning).m_HookFireSpeed.m_Value / 100.0;
      local_28.field_0.x = (this->m_HookPos).field_0.x + fVar21 * (this->m_HookDir).field_0.x;
      local_28.field_1.y = (this->m_HookPos).field_1.y + fVar21 * (this->m_HookDir).field_1.y;
      aVar22 = (this->m_Pos).field_0;
      aVar27 = (this->m_Pos).field_1;
      fVar28 = (float)(this->m_pWorld->m_Tuning).m_HookLength.m_Value / 100.0;
      if (fVar28 < SQRT((aVar22.x - local_28.field_0.x) * (aVar22.x - local_28.field_0.x) +
                        (aVar27.y - local_28.field_1.y) * (aVar27.y - local_28.field_1.y))) {
        this->m_HookState = 1;
        auVar30._0_4_ = local_28.field_0.x - aVar22.x;
        auVar30._4_4_ = local_28.field_1.y - aVar27.y;
        auVar30._8_4_ = (fVar21 * 0.0 + 0.0) - 0.0;
        auVar30._12_4_ = (fVar21 * 0.0 + 0.0) - 0.0;
        auVar38._0_4_ = SQRT(auVar30._0_4_ * auVar30._0_4_ + auVar30._4_4_ * auVar30._4_4_);
        auVar38._4_4_ = auVar38._0_4_;
        auVar38._8_4_ = auVar38._0_4_;
        auVar38._12_4_ = auVar38._0_4_;
        auVar40 = divps(auVar30,auVar38);
        local_28.field_0.x = fVar28 * auVar40._0_4_ + aVar22.x;
        local_28.field_1.y = fVar28 * auVar40._4_4_ + aVar27.y;
      }
      uVar20 = CCollision::IntersectLine
                         (this->m_pCollision,this->m_HookPos,local_28,&local_28,(vec2 *)0x0);
      pCVar5 = this->m_pWorld;
      if ((pCVar5 != (CWorldCore *)0x0) &&
         ((fVar21 = (float)(pCVar5->m_Tuning).m_PlayerHooking.m_Value / 100.0, fVar21 != 0.0 ||
          (NAN(fVar21))))) {
        uVar19 = this->m_TriggeredEvents;
        aVar22 = (this->m_HookPos).field_0;
        aVar27 = (this->m_HookPos).field_1;
        fVar21 = local_28.field_0.x - aVar22.x;
        fVar33 = aVar22.x - local_28.field_0.x;
        fVar48 = aVar27.y - local_28.field_1.y;
        fVar28 = local_28.field_1.y - aVar27.y;
        fVar42 = SQRT(fVar21 * fVar21 + fVar28 * fVar28);
        iVar17 = this->m_HookedPlayer;
        lVar15 = 0;
        fVar41 = 0.0;
        do {
          pCVar6 = pCVar5->m_apCharacters[lVar15];
          if (pCVar6 != this && pCVar6 != (CCharacterCore *)0x0) {
            aVar43 = (pCVar6->m_Pos).field_0;
            aVar44 = (pCVar6->m_Pos).field_1;
            fVar45 = ((aVar44.y - aVar27.y) * (fVar28 / fVar42) +
                     (fVar21 / fVar42) * (aVar43.x - aVar22.x)) /
                     SQRT(fVar33 * fVar33 + fVar48 * fVar48);
            fVar46 = 1.0;
            if (fVar45 <= 1.0) {
              fVar46 = fVar45;
            }
            fVar46 = (float)(~-(uint)(fVar45 < 0.0) & (uint)fVar46);
            fVar45 = aVar43.x - (fVar21 * fVar46 + aVar22.x);
            fVar46 = aVar44.y - (fVar46 * fVar28 + aVar27.y);
            if ((SQRT(fVar45 * fVar45 + fVar46 * fVar46) < 30.0) &&
               ((iVar17 == -1 ||
                (SQRT((aVar22.x - aVar43.x) * (aVar22.x - aVar43.x) +
                      (aVar27.y - aVar44.y) * (aVar27.y - aVar44.y)) < fVar41)))) {
              uVar19 = uVar19 | 4;
              this->m_TriggeredEvents = uVar19;
              this->m_HookState = 5;
              iVar17 = (int)lVar15;
              this->m_HookedPlayer = iVar17;
              fVar41 = aVar22.x - (pCVar6->m_Pos).field_0.x;
              fVar46 = aVar27.y - (pCVar6->m_Pos).field_1.y;
              fVar41 = SQRT(fVar41 * fVar41 + fVar46 * fVar46);
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
      }
      uVar19 = this->m_HookState;
      if (uVar19 == 4) {
        if (uVar20 == 0) {
          uVar19 = 4;
        }
        else {
          this->m_TriggeredEvents = this->m_TriggeredEvents | (uint)((uVar20 & 4) != 0) * 8 + 8;
          uVar19 = uVar20 & 4 ^ 5;
          this->m_HookState = uVar19;
        }
        this->m_HookPos = local_28;
      }
    }
    else if (uVar19 == 3) {
      this->m_HookState = -1;
      goto LAB_00145447;
    }
    if (uVar19 != 5) goto LAB_00145447;
    lVar15 = (long)this->m_HookedPlayer;
    if (lVar15 == -1) {
      vVar29 = this->m_HookPos;
    }
    else {
      pCVar6 = this->m_pWorld->m_apCharacters[lVar15];
      if (pCVar6 != (CCharacterCore *)0x0) {
        this->m_HookPos = pCVar6->m_Pos;
        iVar17 = this->m_HookTick;
        this->m_HookTick = iVar17 + 1;
        if ((iVar17 < 0x3c) && (this->m_pWorld->m_apCharacters[lVar15] != (CCharacterCore *)0x0))
        goto LAB_00145447;
        this->m_HookState = -1;
        this->m_HookedPlayer = -1;
        goto LAB_00144fb2;
      }
      this->m_HookState = -1;
      this->m_HookedPlayer = -1;
      vVar29 = this->m_Pos;
      this->m_HookPos = vVar29;
    }
    auVar31._0_4_ = vVar29.field_0.x - (this->m_Pos).field_0.x;
    auVar31._4_4_ = vVar29.field_1.y - (this->m_Pos).field_1.y;
    auVar31._8_8_ = 0;
    auVar34._0_4_ = SQRT(auVar31._0_4_ * auVar31._0_4_ + auVar31._4_4_ * auVar31._4_4_);
    if (46.0 < auVar34._0_4_) {
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      fVar21 = (float)(this->m_pWorld->m_Tuning).m_HookDragAccel.m_Value / 100.0;
      auVar40 = divps(auVar31,auVar34);
      fVar28 = fVar21 * auVar40._0_4_;
      fVar21 = fVar21 * auVar40._4_4_;
      if (0.0 < fVar21) {
        fVar21 = fVar21 * 0.3;
      }
      fVar33 = 0.95;
      if ((0.0 <= fVar28 || -1 < this->m_Direction) && (fVar28 <= 0.0 || this->m_Direction < 1)) {
        fVar33 = 0.75;
      }
      aVar22 = (this->m_Vel).field_0;
      vVar23.field_0.x = fVar33 * fVar28 + aVar22.x;
      aVar27 = (this->m_Vel).field_1;
      vVar23.field_1.y = fVar21 + aVar27.y;
      fVar21 = SQRT(vVar23.field_0.x * vVar23.field_0.x + vVar23.field_1.y * vVar23.field_1.y);
      if ((fVar21 < (float)(this->m_pWorld->m_Tuning).m_HookDragSpeed.m_Value / 100.0) ||
         (fVar21 < SQRT(aVar22.x * aVar22.x + aVar27.y * aVar27.y))) {
        this->m_Vel = vVar23;
      }
    }
    this->m_HookTick = this->m_HookTick + 1;
  }
LAB_00145447:
  if (this->m_pWorld != (CWorldCore *)0x0) {
    uVar16 = 0;
    do {
      pCVar5 = this->m_pWorld;
      pCVar6 = pCVar5->m_apCharacters[uVar16];
      if (pCVar6 != this && pCVar6 != (CCharacterCore *)0x0) {
        auVar47._0_4_ = (this->m_Pos).field_0.x - (pCVar6->m_Pos).field_0.x;
        auVar47._4_4_ = (this->m_Pos).field_1.y - (pCVar6->m_Pos).field_1.y;
        auVar47._8_8_ = 0;
        fVar48 = SQRT(auVar47._0_4_ * auVar47._0_4_ + auVar47._4_4_ * auVar47._4_4_);
        auVar9._4_4_ = fVar48;
        auVar9._0_4_ = fVar48;
        auVar9._8_4_ = fVar48;
        auVar9._12_4_ = fVar48;
        auVar40 = divps(auVar47,auVar9);
        fVar21 = (float)(pCVar5->m_Tuning).m_PlayerCollision.m_Value / 100.0;
        fVar28 = auVar40._0_4_;
        fVar33 = auVar40._4_4_;
        if ((0.0 < fVar48) && (((fVar21 != 0.0 || (NAN(fVar21))) && (fVar48 < 35.0)))) {
          aVar22 = (this->m_Vel).field_0;
          aVar27 = (this->m_Vel).field_1;
          fVar42 = SQRT(aVar22.x * aVar22.x + aVar27.y * aVar27.y);
          fVar21 = 0.375;
          if (0.0001 < fVar42) {
            fVar21 = (((aVar22.x / fVar42) * fVar28 + fVar33 * (aVar27.y / fVar42) + 1.0) * -0.5 +
                     1.0) * 0.75;
          }
          vVar7.field_1.y = (aVar27.y + fVar21 * (40.600002 - fVar48) * fVar33) * 0.85;
          vVar7.field_0.x = (aVar22.x + fVar21 * (40.600002 - fVar48) * fVar28) * 0.85;
          this->m_Vel = vVar7;
        }
        if (((uVar16 == (uint)this->m_HookedPlayer) &&
            (fVar21 = (float)(pCVar5->m_Tuning).m_PlayerHooking.m_Value / 100.0, 42.0 < fVar48)) &&
           ((fVar21 != 0.0 || (NAN(fVar21))))) {
          auVar39._0_4_ = (float)(pCVar5->m_Tuning).m_HookDragAccel.m_Value;
          auVar39._4_4_ = (float)(pCVar5->m_Tuning).m_HookLength.m_Value;
          auVar39._8_8_ = 0;
          auVar40 = divps(auVar39,_DAT_00146f70);
          fVar21 = (fVar48 / auVar40._4_4_) * auVar40._0_4_;
          fVar28 = fVar28 * fVar21;
          fVar33 = fVar33 * fVar21;
          vVar8.field_1.y = (pCVar6->m_HookDragVel).field_1.y + fVar33 * 1.5;
          vVar8.field_0.x = (pCVar6->m_HookDragVel).field_0.x + fVar28 * 1.5;
          pCVar6->m_HookDragVel = vVar8;
          vVar35.field_0.x = (this->m_HookDragVel).field_0.x + fVar28 * -0.25;
          vVar35.field_1.y = (this->m_HookDragVel).field_1.y + fVar33 * -0.25;
          this->m_HookDragVel = vVar35;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x40);
  }
  vVar29 = this->m_Vel;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = vVar29.field_0;
  auVar26._4_4_ = vVar29.field_1;
  auVar32._0_4_ = SQRT(vVar29.field_0.x * vVar29.field_0.x + vVar29.field_1.y * vVar29.field_1.y);
  if (6000.0 < auVar32._0_4_) {
    auVar32._4_4_ = auVar32._0_4_;
    auVar32._8_8_ = 0;
    auVar40 = divps(auVar26,auVar32);
    vVar24.field_0.x = auVar40._0_4_ * 6000.0;
    vVar24.field_1.y = auVar40._4_4_ * 6000.0;
    this->m_Vel = vVar24;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCharacterCore::Tick(bool UseInput)
{
	m_TriggeredEvents = 0;

	// get ground state
	const bool Grounded =
		m_pCollision->CheckPoint(m_Pos.x+PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5)
		|| m_pCollision->CheckPoint(m_Pos.x-PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5);

	vec2 TargetDirection = normalize(vec2(m_Input.m_TargetX, m_Input.m_TargetY));

	m_Vel.y += m_pWorld->m_Tuning.m_Gravity;

	float MaxSpeed = Grounded ? m_pWorld->m_Tuning.m_GroundControlSpeed : m_pWorld->m_Tuning.m_AirControlSpeed;
	float Accel = Grounded ? m_pWorld->m_Tuning.m_GroundControlAccel : m_pWorld->m_Tuning.m_AirControlAccel;
	float Friction = Grounded ? m_pWorld->m_Tuning.m_GroundFriction : m_pWorld->m_Tuning.m_AirFriction;

	// handle input
	if(UseInput)
	{
		m_Direction = m_Input.m_Direction;
		m_Angle = (int)(angle(vec2(m_Input.m_TargetX, m_Input.m_TargetY))*256.0f);

		// handle jump
		if(m_Input.m_Jump)
		{
			if(!(m_Jumped&1))
			{
				if(Grounded)
				{
					m_TriggeredEvents |= COREEVENTFLAG_GROUND_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_GroundJumpImpulse;
					m_Jumped |= 1;
				}
				else if(!(m_Jumped&2))
				{
					m_TriggeredEvents |= COREEVENTFLAG_AIR_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_AirJumpImpulse;
					m_Jumped |= 3;
				}
			}
		}
		else
			m_Jumped &= ~1;

		// handle hook
		if(m_Input.m_Hook)
		{
			if(m_HookState == HOOK_IDLE)
			{
				m_HookState = HOOK_FLYING;
				m_HookPos = m_Pos+TargetDirection*PHYS_SIZE*1.5f;
				m_HookDir = TargetDirection;
				m_HookedPlayer = -1;
				m_HookTick = 0;
				//m_TriggeredEvents |= COREEVENTFLAG_HOOK_LAUNCH;
			}
		}
		else
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_IDLE;
			m_HookPos = m_Pos;
		}
	}

	// add the speed modification according to players wanted direction
	if(m_Direction < 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, -Accel);
	if(m_Direction > 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, Accel);
	if(m_Direction == 0)
		m_Vel.x *= Friction;

	// handle jumping
	// 1 bit = to keep track if a jump has been made on this input
	// 2 bit = to keep track if a air-jump has been made
	if(Grounded)
		m_Jumped &= ~2;

	// do hook
	if(m_HookState == HOOK_IDLE)
	{
		m_HookedPlayer = -1;
		m_HookState = HOOK_IDLE;
		m_HookPos = m_Pos;
	}
	else if(m_HookState >= HOOK_RETRACT_START && m_HookState < HOOK_RETRACT_END)
	{
		m_HookState++;
	}
	else if(m_HookState == HOOK_RETRACT_END)
	{
		m_HookState = HOOK_RETRACTED;
		//m_TriggeredEvents |= COREEVENTFLAG_HOOK_RETRACT;
	}
	else if(m_HookState == HOOK_FLYING)
	{
		vec2 NewPos = m_HookPos+m_HookDir*m_pWorld->m_Tuning.m_HookFireSpeed;
		if(distance(m_Pos, NewPos) > m_pWorld->m_Tuning.m_HookLength)
		{
			m_HookState = HOOK_RETRACT_START;
			NewPos = m_Pos + normalize(NewPos-m_Pos) * m_pWorld->m_Tuning.m_HookLength;
		}

		// make sure that the hook doesn't go though the ground
		bool GoingToHitGround = false;
		bool GoingToRetract = false;
		int Hit = m_pCollision->IntersectLine(m_HookPos, NewPos, &NewPos, 0);
		if(Hit)
		{
			if(Hit&CCollision::COLFLAG_NOHOOK)
				GoingToRetract = true;
			else
				GoingToHitGround = true;
		}

		// Check against other players first
		if(m_pWorld && m_pWorld->m_Tuning.m_PlayerHooking)
		{
			float Distance = 0.0f;
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
				if(!pCharCore || pCharCore == this)
					continue;

				vec2 ClosestPoint = closest_point_on_line(m_HookPos, NewPos, pCharCore->m_Pos);
				if(distance(pCharCore->m_Pos, ClosestPoint) < PHYS_SIZE+2.0f)
				{
					if(m_HookedPlayer == -1 || distance(m_HookPos, pCharCore->m_Pos) < Distance)
					{
						m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_PLAYER;
						m_HookState = HOOK_GRABBED;
						m_HookedPlayer = i;
						Distance = distance(m_HookPos, pCharCore->m_Pos);
					}
				}
			}
		}

		if(m_HookState == HOOK_FLYING)
		{
			// check against ground
			if(GoingToHitGround)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_GROUND;
				m_HookState = HOOK_GRABBED;
			}
			else if(GoingToRetract)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_HIT_NOHOOK;
				m_HookState = HOOK_RETRACT_START;
			}

			m_HookPos = NewPos;
		}
	}

	if(m_HookState == HOOK_GRABBED)
	{
		if(m_HookedPlayer != -1)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[m_HookedPlayer];
			if(pCharCore)
				m_HookPos = pCharCore->m_Pos;
			else
			{
				// release hook
				m_HookedPlayer = -1;
				m_HookState = HOOK_RETRACTED;
				m_HookPos = m_Pos;
			}

			// keep players hooked for a max of 1.5sec
			//if(Server()->Tick() > hook_tick+(Server()->TickSpeed()*3)/2)
				//release_hooked();
		}

		// don't do this hook rutine when we are hook to a player
		if(m_HookedPlayer == -1 && distance(m_HookPos, m_Pos) > 46.0f)
		{
			vec2 HookVel = normalize(m_HookPos-m_Pos)*m_pWorld->m_Tuning.m_HookDragAccel;
			// the hook as more power to drag you up then down.
			// this makes it easier to get on top of an platform
			if(HookVel.y > 0)
				HookVel.y *= 0.3f;

			// the hook will boost it's power if the player wants to move
			// in that direction. otherwise it will dampen everything abit
			if((HookVel.x < 0 && m_Direction < 0) || (HookVel.x > 0 && m_Direction > 0))
				HookVel.x *= 0.95f;
			else
				HookVel.x *= 0.75f;

			vec2 NewVel = m_Vel+HookVel;

			// check if we are under the legal limit for the hook
			if(length(NewVel) < m_pWorld->m_Tuning.m_HookDragSpeed || length(NewVel) < length(m_Vel))
				m_Vel = NewVel; // no problem. apply

		}

		// release hook (max hook time is 1.25
		m_HookTick++;
		if(m_HookedPlayer != -1 && (m_HookTick > SERVER_TICK_SPEED+SERVER_TICK_SPEED/5 || !m_pWorld->m_apCharacters[m_HookedPlayer]))
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_RETRACTED;
			m_HookPos = m_Pos;
		}
	}

	if(m_pWorld)
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
			if(!pCharCore)
				continue;

			//player *p = (player*)ent;
			if(pCharCore == this) // || !(p->flags&FLAG_ALIVE)
				continue; // make sure that we don't nudge our self

			// handle player <-> player collision
			float Distance = distance(m_Pos, pCharCore->m_Pos);
			vec2 Dir = normalize(m_Pos - pCharCore->m_Pos);
			if(m_pWorld->m_Tuning.m_PlayerCollision && Distance < PHYS_SIZE*1.25f && Distance > 0.0f)
			{
				float a = (PHYS_SIZE*1.45f - Distance);
				float Velocity = 0.5f;

				// make sure that we don't add excess force by checking the
				// direction against the current velocity. if not zero.
				if(length(m_Vel) > 0.0001)
					Velocity = 1-(dot(normalize(m_Vel), Dir)+1)/2;

				m_Vel += Dir*a*(Velocity*0.75f);
				m_Vel *= 0.85f;
			}

			// handle hook influence
			if(m_HookedPlayer == i && m_pWorld->m_Tuning.m_PlayerHooking)
			{
				if(Distance > PHYS_SIZE*1.50f) // TODO: fix tweakable variable
				{
					float Accel = m_pWorld->m_Tuning.m_HookDragAccel * (Distance/m_pWorld->m_Tuning.m_HookLength);

					// add force to the hooked player
					pCharCore->m_HookDragVel += Dir*Accel*1.5f;

					// add a little bit force to the guy who has the grip
					m_HookDragVel -= Dir*Accel*0.25f;
				}
			}
		}
	}

	// clamp the velocity to something sane
	if(length(m_Vel) > 6000)
		m_Vel = normalize(m_Vel) * 6000;
}